

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryDecoder.cc
# Opt level: O3

size_t __thiscall avro::BinaryDecoder::skipArray(BinaryDecoder *this)

{
  uint8_t *puVar1;
  uint8_t *puVar2;
  size_t sVar3;
  ulong uVar4;
  
  while (sVar3 = doDecodeLong(this), (long)sVar3 < 0) {
    uVar4 = doDecodeLong(this);
    puVar1 = (this->in_).next_;
    puVar2 = (this->in_).end_;
    if ((ulong)((long)puVar2 - (long)puVar1) < uVar4) {
      (this->in_).next_ = puVar2;
      (*((this->in_).in_)->_vptr_InputStream[4])();
    }
    else {
      (this->in_).next_ = puVar1 + uVar4;
    }
  }
  return sVar3;
}

Assistant:

size_t BinaryDecoder::skipArray()
{
    for (; ;) {
        int64_t r = doDecodeLong();
        if (r < 0) {
            size_t n = static_cast<size_t>(doDecodeLong()); 
            in_.skipBytes(n);
        } else {
            return static_cast<size_t>(r);
        }
    }
}